

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_stats.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  file_ptr *pfVar1;
  bool bVar2;
  ostream *poVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  index;
  stats s;
  size_type __dnew;
  database db;
  long local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1a0;
  stats local_198;
  char *local_168;
  long local_160;
  undefined4 local_158;
  undefined1 uStack_154;
  undefined1 uStack_153;
  undefined1 uStack_152;
  undefined1 uStack_151;
  undefined1 uStack_150;
  undefined2 uStack_14f;
  undefined1 local_14d;
  long local_148;
  database local_140;
  
  pfVar1 = &local_140.storage_.file_;
  local_140._vptr_database = (_func_int **)pfVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_140,"Dumps statistics for the indexes in a pstore database","");
  bVar2 = pstore::command_line::details::
          parse_command_line_options<char*const*,std::ostream,std::ostream>
                    (argv,argv + argc,(string *)&local_140,
                     (basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                     (basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  if (bVar2) {
    if ((file_ptr *)local_140._vptr_database != pfVar1) {
      operator_delete(local_140._vptr_database,
                      (ulong)((long)&(local_140.storage_.file_.
                                      super___shared_ptr<pstore::file::file_base,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_file_base + 1));
    }
    pstore::database::database
              (&local_140,(string *)((anonymous_namespace)::db_path_abi_cxx11_ + 0x88),read_only,
               true);
    pstore::database::sync(&local_140);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"name,branching-factor,mean-leaf-depth,max-depth,size\n",0x35);
    pstore::index::
    get_index<(pstore::trailer::indices)0,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
              ((index *)&local_1a8,&local_140,false);
    if (local_1a8 != 0) {
      local_198.internal_out_edges_ = 0;
      local_198.internal_visited_ = 0;
      local_198.leaf_depth_ = 0;
      local_198.leaves_visited_ = 0;
      local_198.max_depth_ = 0;
      local_198.db_ = &local_140;
      if ((*(index_pointer *)(local_1a8 + 0x18)).internal_ != (internal_node *)0x0) {
        anon_unknown.dwarf_f4aa::stats::traverse(&local_198,*(index_pointer *)(local_1a8 + 0x18),1);
      }
      local_158 = 0x706d6f63;
      uStack_154 = 0x69;
      uStack_153 = 0x6c;
      uStack_152 = 0x61;
      uStack_151 = 0x74;
      uStack_150 = 0x69;
      uStack_14f = 0x6e6f;
      local_160 = 0xb;
      local_14d = 0;
      local_168 = (char *)&local_158;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_158,0xb);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.internal_visited_ != 0) {
        auVar5._8_4_ = (int)(local_198.internal_out_edges_ >> 0x20);
        auVar5._0_8_ = local_198.internal_out_edges_;
        auVar5._12_4_ = 0x45300000;
        auVar6._8_4_ = (int)(local_198.internal_visited_ >> 0x20);
        auVar6._0_8_ = local_198.internal_visited_;
        auVar6._12_4_ = 0x45300000;
        dVar4 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_out_edges_) -
                4503599627370496.0)) /
                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_visited_) - 4503599627370496.0)
                );
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.leaves_visited_ != 0) {
        auVar7._8_4_ = (int)(local_198.leaf_depth_ >> 0x20);
        auVar7._0_8_ = local_198.leaf_depth_;
        auVar7._12_4_ = 0x45300000;
        auVar8._8_4_ = (int)(local_198.leaves_visited_ >> 0x20);
        auVar8._0_8_ = local_198.leaves_visited_;
        auVar8._12_4_ = 0x45300000;
        dVar4 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaf_depth_) - 4503599627370496.0)) /
                ((auVar8._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaves_visited_) - 4503599627370496.0));
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_168 != (char *)&local_158) {
        operator_delete(local_168,
                        CONCAT17(uStack_151,
                                 CONCAT16(uStack_152,
                                          CONCAT15(uStack_153,CONCAT14(uStack_154,local_158)))) + 1)
        ;
      }
    }
    if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
    }
    pstore::index::
    get_index<(pstore::trailer::indices)1,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<unsigned_char>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
              ((index *)&local_1a8,&local_140,false);
    if (local_1a8 != 0) {
      local_198.internal_out_edges_ = 0;
      local_198.internal_visited_ = 0;
      local_198.leaf_depth_ = 0;
      local_198.leaves_visited_ = 0;
      local_198.max_depth_ = 0;
      local_198.db_ = &local_140;
      if ((*(index_pointer *)(local_1a8 + 0x18)).internal_ != (internal_node *)0x0) {
        anon_unknown.dwarf_f4aa::stats::traverse(&local_198,*(index_pointer *)(local_1a8 + 0x18),1);
      }
      local_148 = 0x11;
      local_168 = (char *)&local_158;
      local_168 = (char *)std::__cxx11::string::_M_create((ulong *)&local_168,(ulong)&local_148);
      local_158 = (undefined4)local_148;
      uStack_154 = (undefined1)((ulong)local_148 >> 0x20);
      uStack_153 = (undefined1)((ulong)local_148 >> 0x28);
      uStack_152 = (undefined1)((ulong)local_148 >> 0x30);
      uStack_151 = (undefined1)((ulong)local_148 >> 0x38);
      builtin_strncpy(local_168,"debug_line_header",0x11);
      local_160 = local_148;
      local_168[local_148] = '\0';
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,local_168,local_148);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.internal_visited_ != 0) {
        auVar9._8_4_ = (int)(local_198.internal_out_edges_ >> 0x20);
        auVar9._0_8_ = local_198.internal_out_edges_;
        auVar9._12_4_ = 0x45300000;
        auVar10._8_4_ = (int)(local_198.internal_visited_ >> 0x20);
        auVar10._0_8_ = local_198.internal_visited_;
        auVar10._12_4_ = 0x45300000;
        dVar4 = ((auVar9._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_out_edges_) -
                4503599627370496.0)) /
                ((auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_visited_) - 4503599627370496.0)
                );
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.leaves_visited_ != 0) {
        auVar11._8_4_ = (int)(local_198.leaf_depth_ >> 0x20);
        auVar11._0_8_ = local_198.leaf_depth_;
        auVar11._12_4_ = 0x45300000;
        auVar12._8_4_ = (int)(local_198.leaves_visited_ >> 0x20);
        auVar12._0_8_ = local_198.leaves_visited_;
        auVar12._12_4_ = 0x45300000;
        dVar4 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaf_depth_) - 4503599627370496.0)) /
                ((auVar12._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaves_visited_) - 4503599627370496.0));
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_168 != (char *)&local_158) {
        operator_delete(local_168,
                        CONCAT17(uStack_151,
                                 CONCAT16(uStack_152,
                                          CONCAT15(uStack_153,CONCAT14(uStack_154,local_158)))) + 1)
        ;
      }
    }
    if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
    }
    pstore::index::
    get_index<(pstore::trailer::indices)2,pstore::database_const,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
              ((index *)&local_1a8,&local_140,false);
    if (local_1a8 != 0) {
      local_198.internal_out_edges_ = 0;
      local_198.internal_visited_ = 0;
      local_198.leaf_depth_ = 0;
      local_198.leaves_visited_ = 0;
      local_198.max_depth_ = 0;
      local_198.db_ = &local_140;
      if ((*(index_pointer *)(local_1a8 + 0x18)).internal_ != (internal_node *)0x0) {
        anon_unknown.dwarf_f4aa::stats::traverse(&local_198,*(index_pointer *)(local_1a8 + 0x18),1);
      }
      local_158 = 0x67617266;
      uStack_154 = 0x6d;
      uStack_153 = 0x65;
      uStack_152 = 0x6e;
      uStack_151 = 0x74;
      local_160 = 8;
      uStack_150 = 0;
      local_168 = (char *)&local_158;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_158,8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.internal_visited_ != 0) {
        auVar13._8_4_ = (int)(local_198.internal_out_edges_ >> 0x20);
        auVar13._0_8_ = local_198.internal_out_edges_;
        auVar13._12_4_ = 0x45300000;
        auVar14._8_4_ = (int)(local_198.internal_visited_ >> 0x20);
        auVar14._0_8_ = local_198.internal_visited_;
        auVar14._12_4_ = 0x45300000;
        dVar4 = ((auVar13._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_out_edges_) -
                4503599627370496.0)) /
                ((auVar14._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_visited_) - 4503599627370496.0)
                );
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.leaves_visited_ != 0) {
        auVar15._8_4_ = (int)(local_198.leaf_depth_ >> 0x20);
        auVar15._0_8_ = local_198.leaf_depth_;
        auVar15._12_4_ = 0x45300000;
        auVar16._8_4_ = (int)(local_198.leaves_visited_ >> 0x20);
        auVar16._0_8_ = local_198.leaves_visited_;
        auVar16._12_4_ = 0x45300000;
        dVar4 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaf_depth_) - 4503599627370496.0)) /
                ((auVar16._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaves_visited_) - 4503599627370496.0));
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_168 != (char *)&local_158) {
        operator_delete(local_168,
                        CONCAT17(uStack_151,
                                 CONCAT16(uStack_152,
                                          CONCAT15(uStack_153,CONCAT14(uStack_154,local_158)))) + 1)
        ;
      }
    }
    if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
    }
    pstore::index::
    get_index<(pstore::trailer::indices)3,pstore::database_const,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const>
              ((index *)&local_1a8,&local_140,false);
    if (local_1a8 != 0) {
      local_198.internal_out_edges_ = 0;
      local_198.internal_visited_ = 0;
      local_198.leaf_depth_ = 0;
      local_198.leaves_visited_ = 0;
      local_198.max_depth_ = 0;
      local_198.db_ = &local_140;
      if ((*(index_pointer *)(local_1a8 + 0x20)).internal_ != (internal_node *)0x0) {
        anon_unknown.dwarf_f4aa::stats::traverse(&local_198,*(index_pointer *)(local_1a8 + 0x20),1);
      }
      local_158 = 0x656d616e;
      local_160 = 4;
      uStack_154 = 0;
      local_168 = (char *)&local_158;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_158,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.internal_visited_ != 0) {
        auVar17._8_4_ = (int)(local_198.internal_out_edges_ >> 0x20);
        auVar17._0_8_ = local_198.internal_out_edges_;
        auVar17._12_4_ = 0x45300000;
        auVar18._8_4_ = (int)(local_198.internal_visited_ >> 0x20);
        auVar18._0_8_ = local_198.internal_visited_;
        auVar18._12_4_ = 0x45300000;
        dVar4 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_out_edges_) -
                4503599627370496.0)) /
                ((auVar18._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_visited_) - 4503599627370496.0)
                );
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.leaves_visited_ != 0) {
        auVar19._8_4_ = (int)(local_198.leaf_depth_ >> 0x20);
        auVar19._0_8_ = local_198.leaf_depth_;
        auVar19._12_4_ = 0x45300000;
        auVar20._8_4_ = (int)(local_198.leaves_visited_ >> 0x20);
        auVar20._0_8_ = local_198.leaves_visited_;
        auVar20._12_4_ = 0x45300000;
        dVar4 = ((auVar19._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaf_depth_) - 4503599627370496.0)) /
                ((auVar20._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaves_visited_) - 4503599627370496.0));
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_168 != (char *)&local_158) {
        operator_delete(local_168,
                        CONCAT17(uStack_151,
                                 CONCAT16(uStack_152,
                                          CONCAT15(uStack_153,CONCAT14(uStack_154,local_158)))) + 1)
        ;
      }
    }
    if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
    }
    pstore::index::
    get_index<(pstore::trailer::indices)4,pstore::database_const,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const>
              ((index *)&local_1a8,&local_140,false);
    if (local_1a8 != 0) {
      local_198.internal_out_edges_ = 0;
      local_198.internal_visited_ = 0;
      local_198.leaf_depth_ = 0;
      local_198.leaves_visited_ = 0;
      local_198.max_depth_ = 0;
      local_198.db_ = &local_140;
      if ((*(index_pointer *)(local_1a8 + 0x20)).internal_ != (internal_node *)0x0) {
        anon_unknown.dwarf_f4aa::stats::traverse(&local_198,*(index_pointer *)(local_1a8 + 0x20),1);
      }
      local_158 = 0x68746170;
      local_160 = 4;
      uStack_154 = 0;
      local_168 = (char *)&local_158;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_158,4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.internal_visited_ != 0) {
        auVar21._8_4_ = (int)(local_198.internal_out_edges_ >> 0x20);
        auVar21._0_8_ = local_198.internal_out_edges_;
        auVar21._12_4_ = 0x45300000;
        auVar22._8_4_ = (int)(local_198.internal_visited_ >> 0x20);
        auVar22._0_8_ = local_198.internal_visited_;
        auVar22._12_4_ = 0x45300000;
        dVar4 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_out_edges_) -
                4503599627370496.0)) /
                ((auVar22._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_visited_) - 4503599627370496.0)
                );
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.leaves_visited_ != 0) {
        auVar23._8_4_ = (int)(local_198.leaf_depth_ >> 0x20);
        auVar23._0_8_ = local_198.leaf_depth_;
        auVar23._12_4_ = 0x45300000;
        auVar24._8_4_ = (int)(local_198.leaves_visited_ >> 0x20);
        auVar24._0_8_ = local_198.leaves_visited_;
        auVar24._12_4_ = 0x45300000;
        dVar4 = ((auVar23._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaf_depth_) - 4503599627370496.0)) /
                ((auVar24._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaves_visited_) - 4503599627370496.0));
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_168 != (char *)&local_158) {
        operator_delete(local_168,
                        CONCAT17(uStack_151,
                                 CONCAT16(uStack_152,
                                          CONCAT15(uStack_153,CONCAT14(uStack_154,local_158)))) + 1)
        ;
      }
    }
    if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
    }
    pstore::index::
    get_index<(pstore::trailer::indices)5,pstore::database_const,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>const>
              ((index *)&local_1a8,&local_140,false);
    if (local_1a8 != 0) {
      local_198.internal_out_edges_ = 0;
      local_198.internal_visited_ = 0;
      local_198.leaf_depth_ = 0;
      local_198.leaves_visited_ = 0;
      local_198.max_depth_ = 0;
      local_198.db_ = &local_140;
      if ((*(index_pointer *)(local_1a8 + 0x18)).internal_ != (internal_node *)0x0) {
        anon_unknown.dwarf_f4aa::stats::traverse(&local_198,*(index_pointer *)(local_1a8 + 0x18),1);
      }
      local_158 = 0x74697277;
      uStack_154 = 0x65;
      uStack_153 = 0;
      local_160 = 5;
      local_168 = (char *)&local_158;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_158,5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.internal_visited_ != 0) {
        auVar25._8_4_ = (int)(local_198.internal_out_edges_ >> 0x20);
        auVar25._0_8_ = local_198.internal_out_edges_;
        auVar25._12_4_ = 0x45300000;
        auVar26._8_4_ = (int)(local_198.internal_visited_ >> 0x20);
        auVar26._0_8_ = local_198.internal_visited_;
        auVar26._12_4_ = 0x45300000;
        dVar4 = ((auVar25._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_out_edges_) -
                4503599627370496.0)) /
                ((auVar26._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.internal_visited_) - 4503599627370496.0)
                );
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      dVar4 = 0.0;
      if (local_198.leaves_visited_ != 0) {
        auVar27._8_4_ = (int)(local_198.leaf_depth_ >> 0x20);
        auVar27._0_8_ = local_198.leaf_depth_;
        auVar27._12_4_ = 0x45300000;
        auVar28._8_4_ = (int)(local_198.leaves_visited_ >> 0x20);
        auVar28._0_8_ = local_198.leaves_visited_;
        auVar28._12_4_ = 0x45300000;
        dVar4 = ((auVar27._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaf_depth_) - 4503599627370496.0)) /
                ((auVar28._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_198.leaves_visited_) - 4503599627370496.0));
      }
      poVar3 = std::ostream::_M_insert<double>(dVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if (local_168 != (char *)&local_158) {
        operator_delete(local_168,
                        CONCAT17(uStack_151,
                                 CONCAT16(uStack_152,
                                          CONCAT15(uStack_153,CONCAT14(uStack_154,local_158)))) + 1)
        ;
      }
    }
    if (local_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a0);
    }
    pstore::database::~database(&local_140);
    return 0;
  }
  exit(1);
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    PSTORE_TRY {
        command_line::parse_command_line_options (
            argc, argv, "Dumps statistics for the indexes in a pstore database");

        database db{db_path.get (), database::access_mode::read_only};
        db.sync (static_cast<unsigned> (revision.get ()));

        command_line::out_stream << PSTORE_NATIVE_TEXT (
            "name,branching-factor,mean-leaf-depth,max-depth,size\n");
#define X(a) dump_index_stats<trailer::indices::a> (db);
        PSTORE_INDICES
#undef X
    }